

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

UINT32 FillBuffer(void *drvStruct,void *userParam,UINT32 bufSize,void *data)

{
  FILE *__stream;
  byte bVar1;
  
  bVar1 = PlayerA::GetState((PlayerA *)userParam);
  __stream = _stderr;
  if ((bVar1 & 1) == 0) {
    bVar1 = PlayerA::GetState((PlayerA *)userParam);
    fprintf(__stream,"Player Warning: calling Render while not playing! playState = 0x%02X\n",
            (ulong)bVar1);
    memset(data,0,(ulong)bufSize);
  }
  else {
    OSMutex_Lock(renderMtx);
    bufSize = PlayerA::Render((PlayerA *)userParam,bufSize,data);
    OSMutex_Unlock(renderMtx);
  }
  return bufSize;
}

Assistant:

static UINT32 FillBuffer(void* drvStruct, void* userParam, UINT32 bufSize, void* data)
{
	PlayerA& myPlr = *(PlayerA*)userParam;
	if (! (myPlr.GetState() & PLAYSTATE_PLAY))
	{
		fprintf(stderr, "Player Warning: calling Render while not playing! playState = 0x%02X\n", myPlr.GetState());
		memset(data, 0x00, bufSize);
		return bufSize;
	}
	
	UINT32 renderedBytes;
	OSMutex_Lock(renderMtx);
	renderedBytes = myPlr.Render(bufSize, data);
	OSMutex_Unlock(renderMtx);
	
	return renderedBytes;
}